

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSplit.c
# Opt level: O3

double bddAnnotateMintermCount(DdManager *manager,DdNode *node,double max,st__table *table)

{
  DdNode *pDVar1;
  int iVar2;
  double *value;
  DdNode *node_00;
  DdNode *pDVar3;
  DdNode *pDVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double *dummy;
  double *local_30;
  
  pDVar4 = (DdNode *)((ulong)node & 0xfffffffffffffffe);
  if (pDVar4->index == 0x7fffffff) {
    dVar5 = max;
    if (manager->one != node) {
      dVar5 = 0.0;
    }
  }
  else {
    iVar2 = st__lookup(table,(char *)node,(char **)&local_30);
    if (iVar2 == 0) {
      pDVar3 = (pDVar4->type).kids.T;
      pDVar1 = (pDVar4->type).kids.E;
      node_00 = (DdNode *)((ulong)pDVar3 ^ 1);
      if (pDVar4 == node) {
        node_00 = pDVar3;
      }
      dVar6 = bddAnnotateMintermCount(manager,node_00,max,table);
      dVar6 = dVar6 * 0.5;
      dVar5 = -1.0;
      if ((dVar6 != -1.0) || (NAN(dVar6))) {
        pDVar3 = (DdNode *)((ulong)pDVar1 ^ 1);
        if (pDVar4 == node) {
          pDVar3 = pDVar1;
        }
        dVar7 = bddAnnotateMintermCount(manager,pDVar3,max,table);
        dVar7 = dVar7 * 0.5;
        dVar5 = -1.0;
        if ((dVar7 != -1.0) || (NAN(dVar7))) {
          value = (double *)malloc(8);
          if (value == (double *)0x0) {
            manager->errorCode = CUDD_MEMORY_OUT;
          }
          else {
            *value = dVar6 + dVar7;
            iVar2 = st__insert(table,(char *)node,(char *)value);
            if (iVar2 != -10000) {
              return dVar6 + dVar7;
            }
            free(value);
          }
          dVar5 = -1.0;
        }
      }
    }
    else {
      dVar5 = *local_30;
    }
  }
  return dVar5;
}

Assistant:

static double
bddAnnotateMintermCount(
  DdManager * manager,
  DdNode * node,
  double  max,
  st__table * table)
{

    DdNode *N,*Nv,*Nnv;
    register double min_v,min_nv;
    register double min_N;
    double *pmin;
    double *dummy;

    statLine(manager);
    N = Cudd_Regular(node);
    if (cuddIsConstant(N)) {
        if (node == DD_ONE(manager)) {
            return(max);
        } else {
            return(0.0);
        }
    }

    if ( st__lookup(table, (const char *)node, (char **)&dummy)) {
        return(*dummy);
    }   
  
    Nv = cuddT(N);
    Nnv = cuddE(N);
    if (N != node) {
        Nv = Cudd_Not(Nv);
        Nnv = Cudd_Not(Nnv);
    }

    /* Recur on the two branches. */
    min_v  = bddAnnotateMintermCount(manager,Nv,max,table) / 2.0;
    if (min_v == (double)CUDD_OUT_OF_MEM)
        return ((double)CUDD_OUT_OF_MEM);
    min_nv = bddAnnotateMintermCount(manager,Nnv,max,table) / 2.0;
    if (min_nv == (double)CUDD_OUT_OF_MEM)
        return ((double)CUDD_OUT_OF_MEM);
    min_N  = min_v + min_nv;

    pmin = ABC_ALLOC(double,1);
    if (pmin == NULL) {
        manager->errorCode = CUDD_MEMORY_OUT;
        return((double)CUDD_OUT_OF_MEM);
    }
    *pmin = min_N;

    if ( st__insert(table,(char *)node, (char *)pmin) == st__OUT_OF_MEM) {
        ABC_FREE(pmin);
        return((double)CUDD_OUT_OF_MEM);
    }
    
    return(min_N);

}